

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::CheckLegalityAndFoldPathDepBranches(BasicBlock *this,GlobOpt *globOpt)

{
  Func **ppFVar1;
  IRKind IVar2;
  OpCode OVar3;
  Type TVar4;
  uint uVar5;
  uint uVar6;
  BasicBlock *pBVar7;
  LabelInstr *pLVar8;
  Type pJVar9;
  Opnd *pOVar10;
  Instr *pIVar11;
  Func *func;
  code *pcVar12;
  bool bVar13;
  OpndKind OVar14;
  BOOLEAN BVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32 offset;
  undefined4 *puVar19;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  StackSym *pSVar20;
  Value *pVVar21;
  Value **ppVVar22;
  LabelInstr *pLVar23;
  LabelInstr *pLVar24;
  JITTimeFunctionBody *pJVar25;
  FunctionJITTimeInfo *pFVar26;
  BranchInstr *pBVar27;
  BasicBlock *pBVar28;
  char16 *pcVar29;
  Func **ppFVar30;
  LabelInstr *pLVar31;
  ByteCodeUsesInstr *instr;
  Instr *instr_00;
  Type *ppFVar32;
  BasicBlock *blNext;
  Type_conflict pBVar33;
  BasicBlock *blNext_1;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  LabelInstr *this_02;
  undefined1 local_b0 [8];
  EditingIterator iter;
  LabelInstr *local_68;
  
  pBVar7 = this->next;
  ppFVar1 = &this->func;
  ppFVar30 = (Func **)&pBVar7->firstInstr;
  if (pBVar7 == (BasicBlock *)0x0) {
    ppFVar30 = ppFVar1;
  }
  lVar36 = 0x18;
  if (pBVar7 == (BasicBlock *)0x0) {
    lVar36 = 0xd0;
  }
  lVar35 = 0x18;
  if (*(long *)((long)&(*ppFVar30)->m_alloc + lVar36) == 0) {
    pLVar24 = (LabelInstr *)0x0;
  }
  else {
    ppFVar30 = (Func **)&pBVar7->firstInstr;
    if (pBVar7 == (BasicBlock *)0x0) {
      lVar35 = 0xd0;
      ppFVar30 = ppFVar1;
    }
    pLVar24 = *(LabelInstr **)(*(long *)((long)&(*ppFVar30)->m_alloc + lVar35) + 0x10);
  }
  pLVar23 = (LabelInstr *)this->firstInstr;
  if (pLVar23 == pLVar24) {
    local_68 = (LabelInstr *)0x0;
    this_02 = (LabelInstr *)0x0;
  }
  else {
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_02 = (LabelInstr *)0x0;
    local_68 = (LabelInstr *)0x0;
    pLVar31 = (LabelInstr *)0x0;
    do {
      if ((pLVar31 != (LabelInstr *)0x0) && ((LabelInstr *)(pLVar31->super_Instr).m_next != pLVar23)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar19 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x1250,
                            "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                            "Modifying instr list but not using EDITING iterator!");
        if (!bVar13) goto LAB_00422e8f;
        *puVar19 = 0;
      }
      bVar13 = OpCodeAttr::HasDeadFallThrough((pLVar23->super_Instr).m_opcode);
      if (bVar13) {
        return;
      }
      if ((pLVar23->super_Instr).m_opcode == InlineeEnd) {
        this_02 = pLVar23;
        local_68 = pLVar23;
      }
      pLVar8 = (LabelInstr *)(pLVar23->super_Instr).m_next;
      pLVar31 = pLVar23;
      pLVar23 = pLVar8;
    } while (pLVar8 != pLVar24);
  }
  pBVar7 = this->next;
  ppFVar30 = (Func **)&pBVar7->firstInstr;
  if (pBVar7 == (BasicBlock *)0x0) {
    ppFVar30 = ppFVar1;
  }
  lVar36 = 0x18;
  if (pBVar7 == (BasicBlock *)0x0) {
    lVar36 = 0xd0;
  }
  pLVar24 = *(LabelInstr **)((long)&(*ppFVar30)->m_alloc + lVar36);
  bVar13 = IsLegalForPathDepBranches(&pLVar24->super_Instr);
  if (bVar13) {
    this_00 = ValueHashTable<Sym_*,_Value_*>::New(globOpt->tempAlloc,8);
    this_01 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,globOpt->tempAlloc,0x3f1274);
    pJVar9 = globOpt->tempAlloc;
    this_01->head = (Type_conflict)0x0;
    this_01->lastFoundIndex = (Type_conflict)0x0;
    this_01->alloc = pJVar9;
    this_01->lastUsedNodePrevNextField = (Type)this_01;
    if (pLVar24 != (LabelInstr *)0x0) {
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      iter.last = (NodeBase *)&this->succList;
      do {
        uVar16 = (uint)(pLVar24->super_Instr).m_kind;
        if (((5 < uVar16) || ((0x2cU >> (uVar16 & 0x1f) & 1) == 0)) &&
           (bVar13 = IsLegalOpcodeForPathDepBrFold(&pLVar24->super_Instr), !bVar13)) {
          return;
        }
        bVar13 = OpCodeAttr::HasDeadFallThrough((pLVar24->super_Instr).m_opcode);
        if (bVar13) {
          return;
        }
        IVar2 = (pLVar24->super_Instr).m_kind;
        if (((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) &&
           ((pLVar24->field_0x78 & 1) != 0)) {
          return;
        }
        if ((pLVar24->super_Instr).m_opcode == InlineeEnd) {
          bVar13 = this_02 != (LabelInstr *)0x0;
          this_02 = pLVar24;
          if (bVar13) {
            return;
          }
        }
        else {
          pOVar10 = (pLVar24->super_Instr).m_dst;
          if (pOVar10 != (Opnd *)0x0) {
            OVar14 = IR::Opnd::GetKind(pOVar10);
            if (OVar14 != OpndKindReg) {
              return;
            }
            pOVar10 = (pLVar24->super_Instr).m_dst;
            OVar14 = IR::Opnd::GetKind(pOVar10);
            if (OVar14 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar19 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                  ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar13) {
LAB_00422e8f:
                pcVar12 = (code *)invalidInstructionException();
                (*pcVar12)();
              }
              *puVar19 = 0;
            }
            pSVar20 = IR::Opnd::GetStackSym(pOVar10);
            BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pSVar20->super_Sym).m_id);
            OVar3 = (pLVar24->super_Instr).m_opcode;
            if (((OVar3 - 0x1e4 < 2) || (OVar3 == Ld_A)) || (OVar3 == LdFld)) {
              pVVar21 = UpdateValueForCopyTypeInstr(this,globOpt,this_00,&pLVar24->super_Instr);
              if ((pVVar21 == (Value *)0x0) && ((pLVar24->super_Instr).m_opcode == LdFld)) {
                return;
              }
            }
            else {
              pSVar20 = IR::Opnd::GetStackSym((pLVar24->super_Instr).m_dst);
              ppVVar22 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew
                                   (this_00,&pSVar20->super_Sym);
              *ppVVar22 = (Value *)0x0;
            }
          }
        }
        if ((pLVar24->super_Instr).m_kind == InstrKindBranch) {
          OVar3 = (pLVar24->super_Instr).m_opcode;
          if (OVar3 < ADD) {
            bVar13 = OVar3 == MultiBr || OVar3 == Br;
          }
          else {
            bVar13 = LowererMD::IsUnconditionalBranch(&pLVar24->super_Instr);
          }
          pLVar23 = (LabelInstr *)
                    (pLVar24->labelRefs).
                    super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator;
          iVar38 = 1;
          if (bVar13 == false) {
            if ((((ulong)*(void **)&pLVar23->field_0x78 & 1) == 0) &&
               (pLVar23 = CanProveConditionalBranch(this,(BranchInstr *)pLVar24,globOpt,this_00),
               pLVar23 != (LabelInstr *)0x0)) goto LAB_0042285c;
          }
          else if ((pLVar23 != (LabelInstr *)0x0) &&
                  (((ulong)*(void **)&pLVar23->field_0x78 & 1) == 0)) {
LAB_0042285c:
            for (pBVar33 = this_01->head; pBVar33 != (Type_conflict)0x0; pBVar33 = pBVar33->next) {
              uVar37 = (pBVar33->data).word;
              if (uVar37 != 0) {
                TVar4 = pBVar33->startIndex;
                uVar34 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                do {
                  BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar34);
                  BVar15 = BVSparse<Memory::JitArenaAllocator>::Test
                                     (pLVar23->m_block->upwardExposedUses,(BVIndex)uVar34 + TVar4);
                  if (BVar15 != '\0') {
                    iVar38 = 1;
                    goto LAB_00422913;
                  }
                  uVar37 = uVar37 & ~(1L << (uVar34 & 0x3f));
                  lVar36 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                    }
                  }
                  uVar34 = (ulong)(-(uint)(uVar37 == 0) | (uint)lVar36);
                } while (uVar37 != 0);
              }
            }
            iVar38 = 0;
LAB_00422913:
            if (pBVar33 == (Type_conflict)0x0) {
              pJVar25 = JITTimeWorkItem::GetJITFunctionBody((*ppFVar1)->m_workItem);
              uVar17 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
              pFVar26 = JITTimeWorkItem::GetJITTimeInfo((*ppFVar1)->m_workItem);
              uVar18 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
              bVar13 = Js::Phases::IsEnabled
                                 ((Phases *)&DAT_015cd718,PathDepBranchFoldingPhase,uVar17,uVar18);
              if (bVar13) {
                OVar3 = (pLVar24->super_Instr).m_opcode;
                if (OVar3 < ADD) {
                  bVar13 = OVar3 == MultiBr || OVar3 == Br;
                }
                else {
                  bVar13 = LowererMD::IsUnconditionalBranch(&pLVar24->super_Instr);
                }
                if (bVar13 == false) {
                  Output::Print(L"TRACE PathDependentBranchFolding: ");
                  uVar16 = this->number;
                  pBVar7 = this->next;
                  ppFVar30 = (Func **)&pBVar7->firstInstr;
                  if (pBVar7 == (BasicBlock *)0x0) {
                    ppFVar30 = ppFVar1;
                  }
                  lVar36 = 0x18;
                  if (pBVar7 == (BasicBlock *)0x0) {
                    lVar36 = 0xd0;
                  }
                  pBVar28 = this;
                  if (*(char *)(*(long *)((long)&(*ppFVar30)->m_alloc + lVar36) + 0x39) == '\x02') {
                    ppFVar30 = (Func **)&pBVar7->firstInstr;
                    if (pBVar7 == (BasicBlock *)0x0) {
                      ppFVar30 = ppFVar1;
                    }
                    lVar36 = 0x18;
                    if (pBVar7 == (BasicBlock *)0x0) {
                      lVar36 = 0xd0;
                    }
                    pBVar27 = IR::Instr::AsBranchInstr
                                        (*(Instr **)((long)&(*ppFVar30)->m_alloc + lVar36));
                    pBVar28 = pBVar27->m_branchTarget->m_block;
                  }
                  else {
                    do {
                      pBVar28 = pBVar28->next;
                      if (pBVar28 == (BasicBlock *)0x0) break;
                    } while ((pBVar28->field_0x18 & 1) != 0);
                  }
                  uVar5 = pBVar28->number;
                  uVar6 = pLVar23->m_block->number;
                  pJVar25 = JITTimeWorkItem::GetJITFunctionBody((*ppFVar1)->m_workItem);
                  pcVar29 = JITTimeFunctionBody::GetDisplayName(pJVar25);
                  Output::Print(L"Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"
                                ,(ulong)uVar16,(ulong)uVar5,(ulong)uVar6,pcVar29);
                  if (globOpt->prePassLoop != (Loop *)0x0) {
                    Output::Print(L"In LoopPrePass\n");
                  }
                  Output::Flush();
                }
              }
              pBVar7 = this->next;
              ppFVar30 = (Func **)&pBVar7->firstInstr;
              if (pBVar7 == (BasicBlock *)0x0) {
                ppFVar30 = ppFVar1;
              }
              lVar36 = 0x18;
              if (pBVar7 == (BasicBlock *)0x0) {
                lVar36 = 0xd0;
              }
              pLVar24 = pLVar23;
              if (*(char *)(*(long *)((long)&(*ppFVar30)->m_alloc + lVar36) + 0x39) == '\x02') {
                ppFVar30 = (Func **)&pBVar7->firstInstr;
                if (pBVar7 == (BasicBlock *)0x0) {
                  ppFVar30 = ppFVar1;
                }
                lVar36 = 0x18;
                if (pBVar7 == (BasicBlock *)0x0) {
                  lVar36 = 0xd0;
                }
                lVar36 = *(long *)((long)&(*ppFVar30)->m_alloc + lVar36);
                if (*(char *)(lVar36 + 0x39) != '\x02') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()")
                  ;
                  if (!bVar13) goto LAB_00422e8f;
                  *puVar19 = 0;
                }
                if (*(LabelInstr **)(lVar36 + 0x68) == pLVar23) {
                  iVar38 = 7;
                  goto LAB_004228e5;
                }
              }
              pBVar7 = this->next;
              ppFVar30 = (Func **)&pBVar7->firstInstr;
              if (pBVar7 == (BasicBlock *)0x0) {
                ppFVar30 = ppFVar1;
              }
              lVar36 = 0x18;
              if (pBVar7 == (BasicBlock *)0x0) {
                lVar36 = 0xd0;
              }
              pLVar31 = (LabelInstr *)
                        IR::Instr::GetNextRealInstrOrLabel
                                  (*(Instr **)((long)&(*ppFVar30)->m_alloc + lVar36));
              pBVar7 = this->next;
              ppFVar30 = (Func **)&pBVar7->firstInstr;
              if (pBVar7 == (BasicBlock *)0x0) {
                ppFVar30 = ppFVar1;
              }
              lVar36 = 0x18;
              if (pBVar7 == (BasicBlock *)0x0) {
                lVar36 = 0xd0;
              }
              pIVar11 = *(Instr **)((long)&(*ppFVar30)->m_alloc + lVar36);
              if (pLVar23 == pLVar31) {
                GlobOpt::ConvertToByteCodeUses(globOpt,pIVar11);
              }
              else {
                func = pIVar11->m_func;
                offset = IR::Instr::GetByteCodeOffset(pIVar11);
                instr = IR::ByteCodeUsesInstr::New(func,offset);
                IR::Instr::InsertAfter(pIVar11,&instr->super_Instr);
                pBVar27 = IR::BranchInstr::New(Br,pLVar23,(pLVar23->super_Instr).m_func);
                if (pIVar11->m_kind == InstrKindBranch) {
                  GlobOpt::ConvertToByteCodeUses(globOpt,pIVar11);
                }
                IR::Instr::InsertAfter(&instr->super_Instr,&pBVar27->super_Instr);
                FlowGraph::AddEdge(globOpt->func->m_fg,this,pLVar23->m_block);
                this->dataUseCount = this->dataUseCount + 1;
              }
              if (this_02 == (LabelInstr *)0x0) {
LAB_00422c95:
                this_02 = (LabelInstr *)0x0;
              }
              else if (this_02 != local_68) {
                pBVar7 = this->next;
                ppFVar30 = (Func **)&pBVar7->firstInstr;
                if (pBVar7 == (BasicBlock *)0x0) {
                  ppFVar30 = ppFVar1;
                }
                lVar36 = 0x18;
                if (pBVar7 == (BasicBlock *)0x0) {
                  lVar36 = 0xd0;
                }
                pIVar11 = *(Instr **)((long)&(*ppFVar30)->m_alloc + lVar36);
                instr_00 = IR::Instr::Copy(&this_02->super_Instr,true);
                IR::Instr::InsertBefore(pIVar11,instr_00);
                GlobOpt::ProcessInlineeEnd(globOpt,&this_02->super_Instr);
                goto LAB_00422c95;
              }
              local_b0 = (undefined1  [8])iter.last;
              iter.super_Iterator.list =
                   (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)iter.last;
              iter.super_Iterator.current = (NodeBase *)0x0;
              while( true ) {
                bVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                         Next((EditingIterator *)local_b0);
                if (!bVar13) break;
                ppFVar32 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                     ((Iterator *)local_b0);
                pBVar7 = (*ppFVar32)->succBlock;
                if (pBVar7 == (BasicBlock *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                      ,0x12fc,"(blockSucc)","blockSucc");
                  if (!bVar13) goto LAB_00422e8f;
                  *puVar19 = 0;
                }
                pLVar31 = (LabelInstr *)pBVar7->firstInstr;
                IVar2 = (pLVar31->super_Instr).m_kind;
                if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                  if (!bVar13) goto LAB_00422e8f;
                  *puVar19 = 0;
                }
                if (pLVar23 != pLVar31) {
                  RemoveSucc(this,pBVar7,globOpt->func->m_fg,true,true);
                  if (this->dataUseCount != 0) {
                    DecrementDataUseCount(this);
                  }
                  if ((pBVar7->predList).
                      super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount
                      .count == 0) {
                    FlowGraph::RemoveBlock((*ppFVar1)->m_fg,pBVar7,globOpt,false);
                  }
                }
              }
              pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                  (((pLVar23->super_Instr).m_func)->m_workItem);
              uVar17 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
              pFVar26 = JITTimeWorkItem::GetJITTimeInfo(((pLVar23->super_Instr).m_func)->m_workItem)
              ;
              uVar18 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
              bVar13 = Js::Phases::IsEnabled
                                 ((Phases *)&DAT_015cd718,PathDepBranchFoldingPhase,uVar17,uVar18);
              if ((bVar13) && (DAT_015d346a == '\x01')) {
                Output::Print(L"After PathDependentBranchFolding: ");
                Func::Dump(*ppFVar1);
              }
              iVar38 = 0;
            }
          }
LAB_004228e5:
          if ((iVar38 != 7) && (iVar38 != 0)) {
            return;
          }
        }
        else {
          pLVar24 = (LabelInstr *)(pLVar24->super_Instr).m_next;
        }
      } while (pLVar24 != (LabelInstr *)0x0);
    }
  }
  return;
}

Assistant:

void
BasicBlock::CheckLegalityAndFoldPathDepBranches(GlobOpt* globOpt)
{
    IR::LabelInstr * lastBranchTarget = nullptr;
    IR::Instr *currentInlineeEnd = nullptr, *unskippedInlineeEnd = nullptr;
    GlobHashTable * localSymToValueMap = nullptr;
    BVSparse<JitArenaAllocator> * currentPathDefines = nullptr;

    FOREACH_INSTR_IN_BLOCK(instr, this)
    {
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode))
        {
            return;
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            unskippedInlineeEnd = currentInlineeEnd = instr;
        }
    } NEXT_INSTR_IN_BLOCK;

    IR::Instr * instr = this->GetLastInstr();

    // We have to first check the legality and only then allocate expensive data structures on the tempArena, because most block will have instructions we cant skip
    if (!IsLegalForPathDepBranches(instr))
    {
        return;
    }

    // Allocate hefty structures, we will not free them because OptBlock does a Reset on the tempAlloc
    localSymToValueMap = GlobHashTable::New(globOpt->tempAlloc, 8);
    currentPathDefines = JitAnew(globOpt->tempAlloc, BVSparse<JitArenaAllocator>, globOpt->tempAlloc);

    /* We start from the current instruction and go on scanning for legality, as long as it is legal to skip an instruction, skip.
     * When we see an unconditional branch, start scanning from the branchTarget
     * When we see a conditional branch, check if we can prove the branch target, if we can, adjust the flowgraph, and continue in the direction of the proven target
     * We stop, when we no longer can skip instructions, either due to legality check or a non provable conditional branch
    */
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return;
        }
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode)) // BailOnNoProfile etc
        {
            return;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return;
            }
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            if (currentInlineeEnd != nullptr)
            {
                return;
            }
            currentInlineeEnd = instr;
        }
        else if (instr->GetDst())
        {
            if (!instr->GetDst()->IsRegOpnd()) // complex dstOpnd, stop.
            {
                return;
            }

            IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
            currentPathDefines->Set(dst->GetStackSym()->m_id);

            if (IsCopyTypeInstr(instr))
            {
                Value *dstValue = UpdateValueForCopyTypeInstr(globOpt, localSymToValueMap, instr);
                if (instr->m_opcode == Js::OpCode::LdFld && !dstValue)
                {
                    // We cannot skip a LdFld if we didnt find its valueInfo in the localValueTable
                    return;
                }
            }
            else
            {
                Value ** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                *localDstValue = nullptr;
            }
        }

        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            IR::LabelInstr* branchTarget = nullptr;

            if (branch->IsUnconditional())
            {
                branchTarget = branch->GetTarget();
                if (!branchTarget)
                {
                    return;
                }
                if (branchTarget->m_isLoopTop)
                {
                    return;
                }
            }
            else
            {
                if (branch->GetTarget()->m_isLoopTop)
                {
                    return;
                }
                branchTarget = CanProveConditionalBranch(branch, globOpt, localSymToValueMap);
                if (!branchTarget)
                {
                    return;
                }
            }

            FOREACH_BITSET_IN_SPARSEBV(id, currentPathDefines)
            {
                if (branchTarget->GetBasicBlock()->upwardExposedUses->Test(id))
                {
                    // it is used in the direction of the branch, we can't skip it
                    return;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, this->func))
            {
                if (!branch->IsUnconditional())
                {
                    Output::Print(_u("TRACE PathDependentBranchFolding: "));
                    Output::Print(_u("Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"),
                        this->GetBlockNum(),
                        this->GetLastInstr()->IsBranchInstr() ? this->GetLastInstr()->AsBranchInstr()->GetTarget()->GetBasicBlock()->GetBlockNum() : this->GetNext()->GetBlockNum(),
                        branchTarget->GetBasicBlock()->GetBlockNum(),
                        this->func->GetJITFunctionBody()->GetDisplayName());
                    if (globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("In LoopPrePass\n"));
                    }
                    Output::Flush();
                }
            }

            if (this->GetLastInstr()->IsBranchInstr() && (this->GetLastInstr()->AsBranchInstr()->GetTarget() == branchTarget))
            {
                // happens on the first block we start from only
                lastBranchTarget = branchTarget;
                instr = lastBranchTarget;
                continue;
            }
            if (branchTarget != this->GetLastInstr()->GetNextRealInstrOrLabel())
            {
                IR::Instr* lastInstr = this->GetLastInstr();
                // We add an empty ByteCodeUses with correct bytecodeoffset, for correct info on a post-op bailout of the previous instr
                IR::Instr* emptyByteCodeUse = IR::ByteCodeUsesInstr::New(lastInstr->m_func, lastInstr->GetByteCodeOffset());
                lastInstr->InsertAfter(emptyByteCodeUse);
                IR::BranchInstr * newBranch = IR::BranchInstr::New(Js::OpCode::Br, branchTarget, branchTarget->m_func);
                if (lastInstr->IsBranchInstr())
                {
                    globOpt->ConvertToByteCodeUses(lastInstr);
                }
                emptyByteCodeUse->InsertAfter(newBranch);
                globOpt->func->m_fg->AddEdge(this, branchTarget->GetBasicBlock());
                this->IncrementDataUseCount();
            }
            else
            {
                // If the new target is a fall through label, delete the branch
                globOpt->ConvertToByteCodeUses(this->GetLastInstr());
            }
            if (currentInlineeEnd != nullptr && currentInlineeEnd != unskippedInlineeEnd)
            {
                this->GetLastInstr()->InsertBefore(currentInlineeEnd->Copy());
                globOpt->ProcessInlineeEnd(currentInlineeEnd);
                currentInlineeEnd = nullptr;
            }
            // We are adding an unconditional branch, go over all the current successors and remove the ones that are dead now
            FOREACH_SUCCESSOR_BLOCK_EDITING(blockSucc, this, iter)
            {
                if (branchTarget != blockSucc->GetFirstInstr()->AsLabelInstr())
                {
                    // Change the old succ edge to dead
                    this->RemoveDeadSucc(blockSucc, globOpt->func->m_fg);
                    if (this->GetDataUseCount() > 0)
                    {
                        this->DecrementDataUseCount();
                    }
                    if (blockSucc->GetPredList()->Count() == 0)
                    {
                        this->func->m_fg->RemoveBlock(blockSucc, globOpt);
                    }
                }
            }NEXT_SUCCESSOR_BLOCK_EDITING;
            lastBranchTarget = branchTarget;
            instr = lastBranchTarget;
#if DBG
            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("After PathDependentBranchFolding: "));
                this->func->Dump();
            }
#endif
        }
        else
        {
            instr = instr->m_next;
        }
    }

    return;
}